

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

void __thiscall capnp::Type::requireUsableAs(Type *this,Type expected)

{
  Which WVar1;
  bool bVar2;
  bool bVar3;
  bool _kjCondition;
  Fault f;
  
  WVar1 = expected.baseType;
  bVar2 = this->baseType == WVar1;
  bVar3 = this->listDepth == expected.listDepth;
  _kjCondition = bVar3 && bVar2;
  if (!bVar3 || !bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[60]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x38c,FAILED,"baseType == expected.baseType && listDepth == expected.listDepth",
               "_kjCondition,\"This type is not compatible with the requested native type.\"",
               &_kjCondition,
               (char (*) [60])"This type is not compatible with the requested native type.");
    kj::_::Debug::Fault::fatal(&f);
  }
  if (WVar1 - 0xf < 3) {
    f.exception = *(Exception **)&this->field_4;
    Schema::requireUsableAs((Schema *)&f,(expected.field_4.schema)->generic);
  }
  else if (WVar1 == LIST) {
    kj::_::unreachable();
  }
  return;
}

Assistant:

void Type::requireUsableAs(Type expected) const {
  KJ_REQUIRE(baseType == expected.baseType && listDepth == expected.listDepth,
             "This type is not compatible with the requested native type.");

  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
    case schema::Type::ANY_POINTER:
      break;

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      Schema(schema).requireUsableAs(expected.schema->generic);
      break;

    case schema::Type::LIST:
      KJ_UNREACHABLE;
  }
}